

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.c
# Opt level: O0

Bigint * s2b(char *s,int nd0,int nd,ULong y9,int dplen)

{
  char *pcVar1;
  int local_38;
  int y;
  int x;
  int k;
  int i;
  Bigint *b;
  int dplen_local;
  ULong y9_local;
  int nd_local;
  int nd0_local;
  char *s_local;
  
  y = 0;
  for (local_38 = 1; local_38 < (nd + 8) / 9; local_38 = local_38 << 1) {
    y = y + 1;
  }
  _k = Balloc(y);
  _k->x[0] = y9;
  _k->wds = 1;
  x = 9;
  if (nd0 < 10) {
    _nd_local = s + (dplen + 9);
  }
  else {
    _nd_local = s + 9;
    do {
      pcVar1 = _nd_local + 1;
      _k = multadd(_k,10,*_nd_local + -0x30);
      x = x + 1;
      _nd_local = pcVar1;
    } while (x < nd0);
    _nd_local = pcVar1 + dplen;
  }
  for (; x < nd; x = x + 1) {
    _k = multadd(_k,10,*_nd_local + -0x30);
    _nd_local = _nd_local + 1;
  }
  return _k;
}

Assistant:

static Bigint *
s2b(const char *s, int nd0, int nd, ULong y9, int dplen MTd)
{
	Bigint *b;
	int i, k;
	Long x, y;

	x = (nd + 8) / 9;
	for(k = 0, y = 1; x > y; y <<= 1, k++) ;
#ifdef Pack_32
	b = Balloc(k MTa);
	b->x[0] = y9;
	b->wds = 1;
#else
	b = Balloc(k+1 MTa);
	b->x[0] = y9 & 0xffff;
	b->wds = (b->x[1] = y9 >> 16) ? 2 : 1;
#endif

	i = 9;
	if (9 < nd0) {
		s += 9;
		do b = multadd(b, 10, *s++ - '0' MTa);
			while(++i < nd0);
		s += dplen;
		}
	else
		s += dplen + 9;
	for(; i < nd; i++)
		b = multadd(b, 10, *s++ - '0' MTa);
	return b;
	}